

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void printNode<cpprofiler::Node&>(Node *node,ostream *os)

{
  bool bVar1;
  int iVar2;
  NodeStatus NVar3;
  ostream *poVar4;
  Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pOVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ostream *in_RSI;
  Node *in_RDI;
  NodeUID *in_stack_ffffffffffffff68;
  ostream *in_stack_ffffffffffffff70;
  
  cpprofiler::Node::nodeUID(in_RDI);
  poVar4 = operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::operator<<(poVar4,", parent: ");
  cpprofiler::Node::parentUID(in_RDI);
  poVar4 = operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  poVar4 = std::operator<<(poVar4,", alt: ");
  iVar2 = cpprofiler::Node::alt(in_RDI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,", kids: ");
  iVar2 = cpprofiler::Node::kids(in_RDI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,", status: ");
  NVar3 = cpprofiler::Node::status(in_RDI);
  std::ostream::operator<<(poVar4,NVar3);
  pOVar5 = cpprofiler::Node::label_abi_cxx11_(in_RDI);
  bVar1 = cpprofiler::
          Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          valid(pOVar5);
  if (bVar1) {
    poVar4 = std::operator<<(in_RSI,", label: ");
    pOVar5 = cpprofiler::Node::label_abi_cxx11_(in_RDI);
    pbVar6 = cpprofiler::
             Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(pOVar5);
    std::operator<<(poVar4,(string *)pbVar6);
  }
  pOVar5 = cpprofiler::Node::nogood_abi_cxx11_(in_RDI);
  bVar1 = cpprofiler::
          Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          valid(pOVar5);
  if (bVar1) {
    poVar4 = std::operator<<(in_RSI,", nogood: ");
    pOVar5 = cpprofiler::Node::nogood_abi_cxx11_(in_RDI);
    pbVar6 = cpprofiler::
             Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(pOVar5);
    std::operator<<(poVar4,(string *)pbVar6);
  }
  pOVar5 = cpprofiler::Node::info_abi_cxx11_(in_RDI);
  bVar1 = cpprofiler::
          Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          valid(pOVar5);
  if (bVar1) {
    poVar4 = std::operator<<(in_RSI,", info: ");
    pOVar5 = cpprofiler::Node::info_abi_cxx11_(in_RDI);
    pbVar6 = cpprofiler::
             Option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(pOVar5);
    std::operator<<(poVar4,(string *)pbVar6);
  }
  std::operator<<(in_RSI,"\n");
  return;
}

Assistant:

static void printNode(T&& node, std::ostream& os) {
	os << node.nodeUID() << ", parent: " << node.parentUID() << ", alt: " << node.alt()
		 << ", kids: " << node.kids() << ", status: " << node.status();
	if (node.label().valid()) {
		os << ", label: " << node.label().value();
	}
	if (node.nogood().valid()) {
		os << ", nogood: " << node.nogood().value();
	}
	if (node.info().valid()) {
		os << ", info: " << node.info().value();
	}
	os << "\n";
}